

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::show(QWidget *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QPlatformIntegration *pQVar4;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  WindowState defaultState;
  QPlatformIntegration *platformIntegration;
  undefined4 in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isWindow(in_RDI);
  if (bVar2) {
    pQVar4 = QGuiApplicationPrivate::platformIntegration();
    iVar3 = (**(code **)(*(long *)pQVar4 + 0xa8))
                      (pQVar4,(in_RDI->data->window_flags).
                              super_QFlagsStorageHelper<Qt::WindowType,_4>.
                              super_QFlagsStorage<Qt::WindowType>.i);
    if (iVar3 == 4) {
      showFullScreen((QWidget *)CONCAT44(4,in_stack_ffffffffffffffd8));
    }
    else if (iVar3 == 2) {
      showMaximized((QWidget *)CONCAT44(2,in_stack_ffffffffffffffd8));
    }
    else {
      (**(code **)(*(long *)in_RDI + 0x68))(in_RDI,1);
    }
  }
  else {
    (**(code **)(*(long *)in_RDI + 0x68))(in_RDI,1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::show()
{
    // Note: We don't call showNormal() as not to clobber Qt::Window(Max/Min)imized

    if (!isWindow()) {
        setVisible(true);
    } else {
        const auto *platformIntegration = QGuiApplicationPrivate::platformIntegration();
        Qt::WindowState defaultState = platformIntegration->defaultWindowState(data->window_flags);
        if (defaultState == Qt::WindowFullScreen)
            showFullScreen();
        else if (defaultState == Qt::WindowMaximized)
            showMaximized();
        else
            setVisible(true);
    }
}